

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

void Abc_SuppGenProfile(Vec_Wrd_t *p,int nBits,int *pCounts)

{
  word wVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)nBits;
  i = 0;
  if (nBits < 1) {
    uVar3 = 0;
    i = 0;
  }
  for (; i < p->nSize; i = i + 1) {
    wVar1 = Vec_WrdEntry(p,i);
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      pCounts[uVar2] =
           pCounts[uVar2] +
           (((uint)(wVar1 >> ((byte)uVar2 & 0x3f)) ^ (uint)(wVar1 >> ((byte)nBits & 0x3f))) & 1);
    }
  }
  return;
}

Assistant:

void Abc_SuppGenProfile( Vec_Wrd_t * p, int nBits, int * pCounts )
{
    word Ent;
    int i, k, b;
    Vec_WrdForEachEntry( p, Ent, i )
        for ( b = ((Ent >> nBits) & 1), k = 0; k < nBits; k++ )
            pCounts[k] += ((Ent >> k) & 1) ^ b;
}